

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O0

void __thiscall Merlin::check(Merlin *this)

{
  runtime_error *prVar1;
  allocator local_109;
  string local_108 [8];
  string err_msg_5;
  allocator local_e1;
  string local_e0 [8];
  string err_msg_4;
  allocator local_b9;
  string local_b8 [8];
  string err_msg_3;
  allocator local_91;
  string local_90 [8];
  string err_msg_2;
  allocator local_69;
  string local_68 [8];
  string err_msg_1;
  allocator local_31;
  string local_30 [8];
  string err_msg;
  Merlin *this_local;
  
  if (this->m_task == 10) {
    if ((this->m_algorithm != 0x3ec) && (this->m_algorithm != 0x3f0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_30,"For PR inference use WMB and BTE algorithms.",&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,local_30);
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (this->m_task == 0x14) {
    if (((((this->m_algorithm != 0x3ec) && (this->m_algorithm != 0x3ea)) &&
         (this->m_algorithm != 0x3e9)) &&
        ((this->m_algorithm != 1000 && (this->m_algorithm != 0x3f0)))) &&
       (this->m_algorithm != 0x3f1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_68,"For MAR inference use WMB, IJGP, LBP, BTE, CTE and GIBBS algorithms.",
                 &local_69);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,local_68);
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (this->m_task == 0x1e) {
    if (((this->m_algorithm != 0x3ec) && (this->m_algorithm != 0x3eb)) &&
       ((this->m_algorithm != 0x3ea && ((this->m_algorithm != 1000 && (this->m_algorithm != 0x3f0)))
        ))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_90,"For MAP inference use WMB, JGLP, IJGP and GIBBS algorithms.",&local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,local_90);
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (this->m_task == 0x28) {
    if ((this->m_algorithm != 0x3ec) && (this->m_algorithm != 0x3f0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b8,"For MMAP inference use WMB and BTE algorithms.",&local_b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,local_b8);
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (this->m_task != 0x32) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_108,"Supported inference tasks are PR, MAR, MAP and MMAP.",&local_109);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,local_108);
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (((this->m_algorithm != 0x3f1) && (this->m_algorithm != 0x3f0)) &&
       (this->m_algorithm != 0x3ec)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e0,"For EM learning use WMB, CTE and BTE inference algorithms.",&local_e1);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,local_e0);
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void Merlin::check() {
	if (m_task == MERLIN_TASK_PR) {
		if (m_algorithm != MERLIN_ALGO_WMB &&
			m_algorithm != MERLIN_ALGO_BTE) {
			std::string err_msg("For PR inference use WMB and BTE algorithms.");
			throw std::runtime_error(err_msg);
		}
	} else if (m_task == MERLIN_TASK_MAR) {
		if (m_algorithm != MERLIN_ALGO_WMB &&
				m_algorithm != MERLIN_ALGO_IJGP &&
				m_algorithm != MERLIN_ALGO_LBP &&
				m_algorithm != MERLIN_ALGO_GIBBS &&
				m_algorithm != MERLIN_ALGO_BTE &&
				m_algorithm != MERLIN_ALGO_CTE) {
			std::string err_msg("For MAR inference use WMB, IJGP, LBP, BTE, CTE and GIBBS algorithms.");
			throw std::runtime_error(err_msg);
		}
	} else if (m_task == MERLIN_TASK_MAP) {
		if (m_algorithm != MERLIN_ALGO_WMB &&
				m_algorithm != MERLIN_ALGO_JGLP &&
				m_algorithm != MERLIN_ALGO_IJGP &&
				m_algorithm != MERLIN_ALGO_GIBBS &&
				m_algorithm != MERLIN_ALGO_BTE) {
			std::string err_msg("For MAP inference use WMB, JGLP, IJGP and GIBBS algorithms.");
			throw std::runtime_error(err_msg);
		}
	} else if (m_task == MERLIN_TASK_MMAP) {
		if (m_algorithm != MERLIN_ALGO_WMB &&
			m_algorithm != MERLIN_ALGO_BTE) {
			std::string err_msg("For MMAP inference use WMB and BTE algorithms.");
			throw std::runtime_error(err_msg);
		}
	} else if (m_task == MERLIN_TASK_EM) {
		if (m_algorithm != MERLIN_ALGO_CTE &&
			m_algorithm != MERLIN_ALGO_BTE &&
			m_algorithm != MERLIN_ALGO_WMB) {
			std::string err_msg("For EM learning use WMB, CTE and BTE inference algorithms.");
			throw std::runtime_error(err_msg);
		}
	} else {
		std::string err_msg("Supported inference tasks are PR, MAR, MAP and MMAP.");
		throw std::runtime_error(err_msg);
	}
}